

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::~DBIter(DBIter *this)

{
  DBIter *this_local;
  
  ~DBIter(this);
  operator_delete(this);
  return;
}

Assistant:

~DBIter() override { delete iter_; }